

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::Imputer::_InternalParse(Imputer *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  StringToDoubleMap *msg;
  string *s;
  uint64_t uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  char cVar3;
  uint32_t tag;
  double *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_48 = (double *)ptr;
LAB_001a5b27:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,(char **)&local_48);
    if (bVar1) {
      return (char *)local_48;
    }
    local_48 = (double *)google::protobuf::internal::ReadTag((char *)local_48,&local_3c,0);
    tag_00 = local_3c;
    cVar3 = (char)local_3c;
    switch(local_3c >> 3) {
    case 1:
      if (cVar3 == '\t') {
        _internal_set_imputeddoublevalue(this,*local_48);
        local_48 = local_48 + 1;
        goto LAB_001a5b27;
      }
      break;
    case 2:
      if (cVar3 != '\x10') break;
      uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_48);
      _internal_set_imputedint64value(this,uVar2);
      goto joined_r0x001a5ca0;
    case 3:
      if (cVar3 == '\x1a') {
        s = _internal_mutable_imputedstringvalue_abi_cxx11_(this);
LAB_001a5c5c:
        local_48 = (double *)
                   google::protobuf::internal::InlineGreedyStringParser(s,(char *)local_48,ctx);
        bVar1 = google::protobuf::internal::VerifyUTF8(s,(char *)0x0);
        if (!bVar1) {
          return (char *)0x0;
        }
        goto joined_r0x001a5ca0;
      }
      break;
    case 4:
      if (cVar3 == '\"') {
        msg = (StringToDoubleMap *)_internal_mutable_imputeddoublearray(this);
LAB_001a5c2d:
        local_48 = (double *)
                   google::protobuf::internal::ParseContext::ParseMessage
                             (ctx,&msg->super_MessageLite,(char *)local_48);
        goto joined_r0x001a5ca0;
      }
      break;
    case 5:
      if (cVar3 == '*') {
        msg = (StringToDoubleMap *)_internal_mutable_imputedint64array(this);
        goto LAB_001a5c2d;
      }
      break;
    case 6:
      if (cVar3 == '2') {
        msg = _internal_mutable_imputedstringdictionary(this);
        goto LAB_001a5c2d;
      }
      break;
    case 7:
      if (cVar3 == ':') {
        msg = (StringToDoubleMap *)_internal_mutable_imputedint64dictionary(this);
        goto LAB_001a5c2d;
      }
      break;
    case 0xb:
      if (cVar3 == 'Y') {
        _internal_set_replacedoublevalue(this,*local_48);
        local_48 = local_48 + 1;
        goto LAB_001a5b27;
      }
      break;
    case 0xc:
      if (cVar3 == '`') {
        uVar2 = google::protobuf::internal::ReadVarint64((char **)&local_48);
        _internal_set_replaceint64value(this,uVar2);
        goto joined_r0x001a5ca0;
      }
      break;
    case 0xd:
      if (cVar3 == 'j') {
        s = _internal_mutable_replacestringvalue_abi_cxx11_(this);
        goto LAB_001a5c5c;
      }
    }
    if ((local_3c == 0) || ((local_3c & 7) == 4)) {
      if (local_48 == (double *)0x0) {
        return (char *)0x0;
      }
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
      return (char *)local_48;
    }
    unknown = google::protobuf::internal::InternalMetadata::
              mutable_unknown_fields<std::__cxx11::string>(local_38);
    local_48 = (double *)
               google::protobuf::internal::UnknownFieldParse(tag_00,unknown,(char *)local_48,ctx);
joined_r0x001a5ca0:
    if (local_48 == (double *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* Imputer::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // double imputedDoubleValue = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 9)) {
          _internal_set_imputeddoublevalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // int64 imputedInt64Value = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          _internal_set_imputedint64value(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string imputedStringValue = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          auto str = _internal_mutable_imputedstringvalue();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.DoubleVector imputedDoubleArray = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_imputeddoublearray(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64Vector imputedInt64Array = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_imputedint64array(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.StringToDoubleMap imputedStringDictionary = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 50)) {
          ptr = ctx->ParseMessage(_internal_mutable_imputedstringdictionary(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64ToDoubleMap imputedInt64Dictionary = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 58)) {
          ptr = ctx->ParseMessage(_internal_mutable_imputedint64dictionary(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // double replaceDoubleValue = 11;
      case 11:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 89)) {
          _internal_set_replacedoublevalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // int64 replaceInt64Value = 12;
      case 12:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 96)) {
          _internal_set_replaceint64value(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string replaceStringValue = 13;
      case 13:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 106)) {
          auto str = _internal_mutable_replacestringvalue();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}